

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<0,_2,_9,_0,_9>::evaluate
               (ShaderEvalContext *evalCtx)

{
  int i;
  float *pfVar1;
  long lVar2;
  undefined4 *puVar3;
  int row;
  long lVar4;
  long lVar5;
  undefined1 auVar6 [16];
  bool bVar8;
  undefined4 uVar9;
  Vector<float,_3> res_1;
  Vector<float,_3> res;
  Mat3 m;
  float afStack_b8 [6];
  float local_a0 [2];
  undefined8 local_98;
  undefined4 local_90;
  Matrix<float,_3,_3> local_88;
  Matrix<float,_3,_3> local_5c;
  Matrix<float,_3,_3> local_38;
  long lVar7;
  
  pfVar1 = (float *)&local_88;
  lVar2 = 0;
  lVar4 = 0;
  do {
    lVar5 = 0;
    auVar6 = _DAT_00632fe0;
    do {
      bVar8 = SUB164(auVar6 ^ _DAT_00625ae0,4) == -0x80000000 &&
              SUB164(auVar6 ^ _DAT_00625ae0,0) < -0x7ffffffd;
      if (bVar8) {
        uVar9 = 0x3f800000;
        if (lVar2 != lVar5) {
          uVar9 = 0;
        }
        *(undefined4 *)((long)pfVar1 + lVar5) = uVar9;
      }
      if (bVar8) {
        uVar9 = 0x3f800000;
        if (lVar2 + -0xc != lVar5) {
          uVar9 = 0;
        }
        *(undefined4 *)((long)pfVar1 + lVar5 + 0xc) = uVar9;
      }
      lVar7 = auVar6._8_8_;
      auVar6._0_8_ = auVar6._0_8_ + 2;
      auVar6._8_8_ = lVar7 + 2;
      lVar5 = lVar5 + 0x18;
    } while (lVar5 != 0x30);
    lVar4 = lVar4 + 1;
    lVar2 = lVar2 + 0xc;
    pfVar1 = pfVar1 + 1;
  } while (lVar4 != 3);
  local_88.m_data.m_data[0].m_data[0] = evalCtx->in[0].m_data[0];
  local_88.m_data.m_data[0].m_data[1] = evalCtx->in[0].m_data[1];
  local_88.m_data.m_data[0].m_data[2] = evalCtx->in[0].m_data[2];
  local_88.m_data.m_data[1].m_data._4_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 1);
  local_88.m_data.m_data[1].m_data[0] = evalCtx->in[1].m_data[0];
  local_88.m_data.m_data[2].m_data[2] = evalCtx->in[2].m_data[2];
  local_88.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)evalCtx->in[2].m_data;
  pfVar1 = (float *)&local_38;
  local_38.m_data.m_data[1].m_data[1] = 0.0;
  local_38.m_data.m_data[1].m_data[2] = 0.0;
  local_38.m_data.m_data[2].m_data[0] = 0.0;
  local_38.m_data.m_data[2].m_data[1] = 0.0;
  local_38.m_data.m_data[0].m_data[0] = 0.0;
  local_38.m_data.m_data[0].m_data[1] = 0.0;
  local_38.m_data.m_data[0].m_data[2] = 0.0;
  local_38.m_data.m_data[1].m_data[0] = 0.0;
  local_38.m_data.m_data[2].m_data[2] = 0.0;
  puVar3 = &DAT_0078b394;
  lVar2 = 0;
  do {
    lVar4 = 0;
    do {
      *(undefined4 *)((long)pfVar1 + lVar4) = *(undefined4 *)((long)puVar3 + lVar4);
      lVar4 = lVar4 + 0xc;
    } while (lVar4 != 0x24);
    lVar2 = lVar2 + 1;
    pfVar1 = pfVar1 + 1;
    puVar3 = puVar3 + 1;
  } while (lVar2 != 3);
  tcu::operator+(&local_5c,&local_88,&local_38);
  local_98 = (ulong)local_98._4_4_ << 0x20;
  local_a0[0] = 0.0;
  local_a0[1] = 0.0;
  lVar2 = 0;
  do {
    local_a0[lVar2] =
         local_5c.m_data.m_data[0].m_data[lVar2] + local_5c.m_data.m_data[1].m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  afStack_b8[4] = 0.0;
  afStack_b8[2] = 0.0;
  afStack_b8[3] = 0.0;
  lVar2 = 0;
  do {
    afStack_b8[lVar2 + 2] =
         local_a0[lVar2] + *(float *)((long)(local_38.m_data.m_data + -1) + lVar2 * 4);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_98 = 0x100000000;
  local_90 = 2;
  lVar2 = 2;
  do {
    (evalCtx->color).m_data[(int)local_a0[lVar2]] = afStack_b8[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		evalCtx.color.xyz() = reduceToVec3(getInputValue<In0Type, In0DataType>(evalCtx, 0) + getInputValue<In1Type, In1DataType>(evalCtx, 1));
	}